

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# quirrel_parser.cpp
# Opt level: O2

Node * __thiscall Parser::parseClassMember(Parser *this)

{
  bool bVar1;
  int iVar2;
  Node *pNVar3;
  socklen_t *in_RCX;
  sockaddr *in_RDX;
  sockaddr *__addr;
  
  iVar2 = accept(this,0x3b,in_RDX,in_RCX);
  if ((char)iVar2 != '\0') {
    pNVar3 = createBaseNode(this,this->tok);
    return pNVar3;
  }
  iVar2 = accept(this,0x56,__addr,in_RCX);
  if ((char)iVar2 != '\0') {
    pNVar3 = createAccessConstructorNode(this,this->tok);
    return pNVar3;
  }
  bVar1 = expect(this,TK_IDENTIFIER);
  if (bVar1) {
    pNVar3 = createIdentifierNode(this,this->tok);
    return pNVar3;
  }
  return (Node *)0x0;
}

Assistant:

Node * parseClassMember()
  {
    if (accept(TK_BASE))
      return createBaseNode(*tok);

    if (accept(TK_CONSTRUCTOR))
      return createAccessConstructorNode(*tok);

    if (expect(TK_IDENTIFIER))
      return createIdentifierNode(*tok);

    return nullptr;
  }